

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainter.cpp
# Opt level: O2

void __thiscall QPainter::drawPoints(QPainter *this,QPointF *points,int pointCount)

{
  long lVar1;
  _Head_base<0UL,_QPainterPrivate_*,_false> this_00;
  TransformationType TVar2;
  PenCapStyle PVar3;
  QPainterState *pQVar4;
  QPaintEngine *pQVar5;
  long lVar6;
  long in_FS_OFFSET;
  QPainterPath path;
  QPen pen;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00._M_head_impl =
       (this->d_ptr)._M_t.
       super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>._M_t.
       super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
       super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl;
  if (((this_00._M_head_impl)->engine)._M_t.
      super___uniq_ptr_impl<QPaintEngine,_QPainterPrivate::QPaintEngineDestructor>._M_t.
      super__Tuple_impl<0UL,_QPaintEngine_*,_QPainterPrivate::QPaintEngineDestructor>.
      super__Head_base<0UL,_QPaintEngine_*,_false>._M_head_impl == (QPaintEngine *)0x0) {
    pen.d.d.ptr._0_4_ = 2;
    pen.d.d.ptr._4_4_ = 0;
    QMessageLogger::warning((char *)&pen,"QPainter::drawPoints: Painter not active");
  }
  else if (0 < pointCount) {
    pQVar5 = &(this_00._M_head_impl)->extended->super_QPaintEngine;
    if (pQVar5 != (QPaintEngine *)0x0) {
LAB_00387247:
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        (*((QPaintEngine *)&pQVar5->_vptr_QPaintEngine)->_vptr_QPaintEngine[0xc])
                  (pQVar5,points,(ulong)(uint)pointCount);
        return;
      }
      goto LAB_0038744c;
    }
    QPainterPrivate::updateState(this_00._M_head_impl,&(this_00._M_head_impl)->state);
    pQVar4 = ((this_00._M_head_impl)->state)._M_t.
             super___uniq_ptr_impl<QPainterState,_std::default_delete<QPainterState>_>._M_t.
             super__Tuple_impl<0UL,_QPainterState_*,_std::default_delete<QPainterState>_>.
             super__Head_base<0UL,_QPainterState_*,_false>._M_head_impl;
    if (pQVar4->emulationSpecifier == 1) {
      TVar2 = QTransform::type(&pQVar4->matrix);
      if (TVar2 == TxTranslate) {
        for (lVar6 = 0; (ulong)(uint)pointCount << 4 != lVar6; lVar6 = lVar6 + 0x10) {
          pen.d.d.ptr = (DataPtr)(((((this_00._M_head_impl)->state)._M_t.
                                    super___uniq_ptr_impl<QPainterState,_std::default_delete<QPainterState>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_QPainterState_*,_std::default_delete<QPainterState>_>
                                    .super__Head_base<0UL,_QPainterState_*,_false>._M_head_impl)->
                                  matrix).m_matrix[2][0] + *(double *)((long)&points->xp + lVar6));
          pQVar5 = ((this_00._M_head_impl)->engine)._M_t.
                   super___uniq_ptr_impl<QPaintEngine,_QPainterPrivate::QPaintEngineDestructor>._M_t
                   .super__Tuple_impl<0UL,_QPaintEngine_*,_QPainterPrivate::QPaintEngineDestructor>.
                   super__Head_base<0UL,_QPaintEngine_*,_false>._M_head_impl;
          (*pQVar5->_vptr_QPaintEngine[0xc])(pQVar5,&pen,1);
        }
        goto LAB_0038742d;
      }
      pQVar4 = ((this_00._M_head_impl)->state)._M_t.
               super___uniq_ptr_impl<QPainterState,_std::default_delete<QPainterState>_>._M_t.
               super__Tuple_impl<0UL,_QPainterState_*,_std::default_delete<QPainterState>_>.
               super__Head_base<0UL,_QPainterState_*,_false>._M_head_impl;
    }
    else if (pQVar4->emulationSpecifier == 0) {
      pQVar5 = ((this_00._M_head_impl)->engine)._M_t.
               super___uniq_ptr_impl<QPaintEngine,_QPainterPrivate::QPaintEngineDestructor>._M_t.
               super__Tuple_impl<0UL,_QPaintEngine_*,_QPainterPrivate::QPaintEngineDestructor>.
               super__Head_base<0UL,_QPaintEngine_*,_false>._M_head_impl;
      goto LAB_00387247;
    }
    pen.d.d.ptr._0_4_ = 0xaaaaaaaa;
    pen.d.d.ptr._4_4_ = 0xaaaaaaaa;
    QPen::QPen(&pen,&pQVar4->pen);
    PVar3 = QPen::capStyle(&pen);
    if (PVar3 == FlatCap) {
      save(this);
      QPen::setCapStyle(&pen,SquareCap);
      setPen(this,&pen);
    }
    path.d_ptr.d.ptr = (QExplicitlySharedDataPointer<QPainterPathPrivate>)&DAT_aaaaaaaaaaaaaaaa;
    QPainterPath::QPainterPath(&path);
    for (lVar6 = 0; (ulong)(uint)pointCount << 4 != lVar6; lVar6 = lVar6 + 0x10) {
      QPainterPath::moveTo
                (&path,*(qreal *)((long)&points->xp + lVar6),*(qreal *)((long)&points->yp + lVar6));
      QPainterPath::lineTo
                (&path,*(double *)((long)&points->xp + lVar6) + 0.0001,
                 *(qreal *)((long)&points->yp + lVar6));
    }
    QPainterPrivate::draw_helper(this_00._M_head_impl,&path,StrokeDraw);
    if (PVar3 == FlatCap) {
      restore(this);
    }
    QPainterPath::~QPainterPath(&path);
    QPen::~QPen(&pen);
  }
LAB_0038742d:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_0038744c:
  __stack_chk_fail();
}

Assistant:

void QPainter::drawPoints(const QPointF *points, int pointCount)
{
#ifdef QT_DEBUG_DRAW
    if (qt_show_painter_debug_output)
        printf("QPainter::drawPoints(), count=%d\n", pointCount);
#endif
    Q_D(QPainter);

    if (!d->engine) {
        qWarning("QPainter::drawPoints: Painter not active");
        return;
    }

    if (pointCount <= 0)
        return;

    if (d->extended) {
        d->extended->drawPoints(points, pointCount);
        return;
    }

    d->updateState(d->state);

    if (!d->state->emulationSpecifier) {
        d->engine->drawPoints(points, pointCount);
        return;
    }

    if (d->state->emulationSpecifier == QPaintEngine::PrimitiveTransform
        && d->state->matrix.type() == QTransform::TxTranslate) {
        // ### use drawPoints function
        for (int i=0; i<pointCount; ++i) {
            QPointF pt(points[i].x() + d->state->matrix.dx(),
                       points[i].y() + d->state->matrix.dy());
            d->engine->drawPoints(&pt, 1);
        }
    } else {
        QPen pen = d->state->pen;
        bool flat_pen = pen.capStyle() == Qt::FlatCap;
        if (flat_pen) {
            save();
            pen.setCapStyle(Qt::SquareCap);
            setPen(pen);
        }
        QPainterPath path;
        for (int i=0; i<pointCount; ++i) {
            path.moveTo(points[i].x(), points[i].y());
            path.lineTo(points[i].x() + 0.0001, points[i].y());
        }
        d->draw_helper(path, QPainterPrivate::StrokeDraw);
        if (flat_pen)
            restore();
    }
}